

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QLocale __thiscall QLocale::collation(QLocale *this)

{
  qsizetype qVar1;
  QSystemLocale *pQVar2;
  QLocale *in_RSI;
  long in_FS_OFFSET;
  QString local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RSI->d).d.ptr)->m_data == &systemLocaleData) {
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    local_50 = 2;
    (*pQVar2->_vptr_QSystemLocale[2])(&local_40,pQVar2,0x21);
    ::QVariant::toString(&local_88,&local_40);
    ::QVariant::~QVariant(&local_40);
    ::QVariant::~QVariant((QVariant *)&local_68);
    qVar1 = local_88.d.size;
    if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
      QLocale(this,&local_88);
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((undefined1 *)qVar1 != (undefined1 *)0x0) goto LAB_00315d64;
  }
  QLocale(this,in_RSI);
LAB_00315d64:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QSharedDataPointer<QLocalePrivate>)(QSharedDataPointer<QLocalePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QLocale QLocale::collation() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        const auto res = systemLocale()->query(QSystemLocale::Collation).toString();
        if (!res.isEmpty())
            return QLocale(res);
    }
#endif
    return *this;
}